

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

void __thiscall
CorUnix::CSharedMemoryObject::CleanupForProcessShutdown(CSharedMemoryObject *this,CPalThread *pthr)

{
  OBJECTCLEANUPROUTINE p_Var1;
  bool bVar2;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CleanupForProcessShutdown",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x26c);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    bVar2 = DereferenceSharedData(this);
    p_Var1 = ((this->super_CPalObjectBase).m_pot)->m_pCleanupRoutine;
    if (p_Var1 != (OBJECTCLEANUPROUTINE)0x0) {
      (*p_Var1)(pthr,(IPalObject *)this,true,bVar2);
    }
    (this->super_CPalObjectBase).m_pthrCleanup = pthr;
    CPalThread::AddThreadReference(pthr);
    (*(this->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[0xb])(this);
    InternalFree(this);
    CPalThread::ReleaseThreadReference(pthr);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void
CSharedMemoryObject::CleanupForProcessShutdown(
    CPalThread *pthr
    )
{
    bool fCleanupSharedState;

    _ASSERTE(NULL != pthr);
    
    ENTRY("CSharedMemoryObject::CleanupForProcessShutdown"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );

    fCleanupSharedState = DereferenceSharedData();

    if (NULL != m_pot->GetObjectCleanupRoutine())
    {
        (*m_pot->GetObjectCleanupRoutine())(
            pthr,
            static_cast<IPalObject*>(this),
            TRUE,
            fCleanupSharedState
            );
    }

    //
    // We need to do two things with the calling thread data here:
    // 1) store it in m_pthrCleanup so it is available to the destructors
    // 2) Add a reference to it before starting any cleanup, and release
    //    that reference afterwords.
    //
    // Step 2 is necessary when we're cleaning up the thread object that
    // represents the calling thread -- it ensures that the thread data
    // is available throughout the entire cleanup process.
    //

    m_pthrCleanup = pthr;
    pthr->AddThreadReference();
    
    InternalDelete(this);

    pthr->ReleaseThreadReference();

    LOGEXIT("CSharedMemoryObject::CleanupForProcessShutdown\n");
}